

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_fast_force
              (char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  ushort uVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  char *pcVar5;
  int *piVar6;
  char *pcVar7;
  char *pcVar8;
  long *plVar9;
  long *plVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  BYTE *s_1;
  long *plVar15;
  uint uVar16;
  uint uVar17;
  int *piVar18;
  char *pcVar19;
  BYTE *e;
  long *plVar20;
  long *plVar21;
  int iVar22;
  BYTE *s;
  int local_4088;
  LZ4_stream_t ctx;
  
  memset(&ctx,0,0x4020);
  pcVar7 = dest + maxOutputSize;
  iVar22 = (int)source;
  local_4088 = (int)dest;
  if (inputSize < 0x1000b) {
    iVar14 = 0;
    if ((uint)inputSize < 0x7e000001) {
      pcVar19 = dest;
      plVar15 = (long *)source;
      if (0xc < (uint)inputSize) {
        do {
          uVar11 = 1;
          lVar13 = *(long *)((long)plVar15 + 1);
          plVar9 = (long *)((long)plVar15 + 1);
          uVar16 = acceleration << 6;
          do {
            plVar10 = plVar9;
            plVar9 = (long *)(uVar11 + (long)plVar10);
            if (source + (long)inputSize + -0xc < plVar9) goto LAB_001354a2;
            uVar11 = (ulong)(uVar16 >> 6);
            uVar16 = uVar16 + 1;
            uVar12 = (ulong)((uint)((ulong)(lVar13 * 0xcf1bbcdcbb) >> 0x1b) & 0x1fff);
            uVar1 = *(ushort *)((long)ctx.table + uVar12 * 2);
            lVar13 = *plVar9;
            sVar3 = (short)source;
            *(short *)((long)ctx.table + uVar12 * 2) = (short)plVar10 - sVar3;
          } while (*(int *)(source + uVar1) != (int)*plVar10);
          pcVar8 = source + uVar1;
          if ((plVar15 < plVar10) && (uVar1 != 0)) {
            pcVar5 = source + ((ulong)uVar1 - 1);
            plVar9 = plVar10;
            while (pcVar8 = pcVar5, plVar10 = (long *)((long)plVar9 + -1),
                  *(char *)plVar10 == *pcVar8) {
              if ((plVar10 <= plVar15) || (pcVar5 = pcVar8 + -1, plVar9 = plVar10, pcVar8 <= source)
                 ) goto LAB_00134e41;
            }
            pcVar8 = pcVar8 + 1;
            plVar10 = plVar9;
          }
LAB_00134e41:
          uVar11 = (long)plVar10 - (long)plVar15;
          if (pcVar7 < pcVar19 + (uVar11 & 0xffffffff) / 0xff + (uVar11 & 0xffffffff) + 9) {
            return 0;
          }
          plVar9 = (long *)(pcVar19 + 1);
          if ((uint)uVar11 < 0xf) {
            *pcVar19 = (char)uVar11 << 4;
          }
          else {
            uVar16 = (uint)uVar11 - 0xf;
            *pcVar19 = -0x10;
            if (0xfe < (int)uVar16) {
              if (0x1fc < uVar16) {
                uVar16 = 0x1fd;
              }
              uVar16 = ((int)plVar10 - (uVar16 + (int)plVar15)) + 0xef;
              memset(plVar9,0xff,(ulong)uVar16 / 0xff + 1);
              plVar9 = (long *)(pcVar19 + (ulong)uVar16 / 0xff + 2);
              uVar16 = (((int)plVar10 - (int)plVar15) + (uVar16 % 0xff - uVar16)) - 0x10e;
            }
            *(char *)plVar9 = (char)uVar16;
            plVar9 = (long *)((long)plVar9 + 1);
          }
          plVar20 = (long *)((uVar11 & 0xffffffff) + (long)plVar9);
          do {
            *plVar9 = *plVar15;
            plVar9 = plVar9 + 1;
            plVar15 = plVar15 + 1;
          } while (plVar9 < plVar20);
          *(short *)plVar20 = (short)plVar10 - (short)pcVar8;
          uVar16 = LZ4_count((BYTE *)((long)plVar10 + 4),(BYTE *)(pcVar8 + 4),
                             (BYTE *)(source + (long)inputSize + -5));
          if (pcVar7 < (char *)((long)plVar20 + (ulong)(uVar16 >> 8) + 8)) {
            return 0;
          }
          plVar15 = (long *)((long)plVar10 + (ulong)(uVar16 + 4));
          pcVar8 = pcVar19;
          while( true ) {
            pcVar19 = (char *)((long)plVar20 + 2);
            if (uVar16 < 0xf) {
              *pcVar8 = *pcVar8 + (char)uVar16;
            }
            else {
              *pcVar8 = *pcVar8 + '\x0f';
              uVar11 = (ulong)(uVar16 - 0xf);
              if (0x1fd < uVar16 - 0xf) {
                uVar11 = (ulong)(uVar16 - 0x20d) % 0x1fe;
                uVar12 = (ulong)(((uVar16 - 0x20d) / 0x1fe) * 2);
                memset(pcVar19,0xff,uVar12 + 2);
                pcVar19 = (char *)((long)plVar20 + uVar12 + 4);
              }
              if (0xfe < (uint)uVar11) {
                uVar11 = (ulong)((uint)uVar11 - 0xff);
                *pcVar19 = -1;
                pcVar19 = pcVar19 + 1;
              }
              *pcVar19 = (char)uVar11;
              pcVar19 = pcVar19 + 1;
            }
            if (source + (long)inputSize + -0xc < plVar15) goto LAB_001354a2;
            sVar4 = (short)plVar15;
            *(short *)((long)ctx.table +
                      (ulong)((uint)((ulong)(*(long *)((long)plVar15 + -2) * 0xcf1bbcdcbb) >> 0x1b)
                             & 0x1fff) * 2) = (sVar4 + -2) - sVar3;
            uVar11 = (ulong)((uint)((ulong)(*plVar15 * 0xcf1bbcdcbb) >> 0x1b) & 0x1fff);
            uVar12 = (ulong)*(ushort *)((long)ctx.table + uVar11 * 2);
            piVar18 = (int *)(source + uVar12);
            *(short *)((long)ctx.table + uVar11 * 2) = sVar4 - sVar3;
            if ((source + uVar12 + 0xffff < plVar15) || (*piVar18 != (int)*plVar15)) break;
            plVar20 = (long *)(pcVar19 + 1);
            *pcVar19 = '\0';
            *(short *)(pcVar19 + 1) = sVar4 - (short)piVar18;
            uVar16 = LZ4_count((BYTE *)((long)plVar15 + 4),(BYTE *)(piVar18 + 1),
                               (BYTE *)(source + (long)inputSize + -5));
            plVar15 = (long *)((long)plVar15 + (ulong)(uVar16 + 4));
            pcVar8 = pcVar19;
            if (pcVar7 < pcVar19 + (ulong)(uVar16 >> 8) + 9) {
              return 0;
            }
          }
        } while( true );
      }
LAB_001354a2:
      pcVar7 = source + ((long)inputSize - (long)plVar15);
      iVar14 = 0;
      if (pcVar19 + (long)(pcVar7 + ((ulong)(pcVar7 + 0xf0) / 0xff - (long)dest) + 1) <=
          (char *)(ulong)(uint)maxOutputSize) {
        if (pcVar7 < (char *)0xf) {
          *pcVar19 = (char)pcVar7 << 4;
        }
        else {
          pcVar8 = pcVar7 + -0xf;
          *pcVar19 = -0x10;
          pcVar5 = pcVar19 + 1;
          if ((char *)0xfe < pcVar8) {
            uVar11 = (ulong)(pcVar7 + -0x10e) / 0xff;
            memset(pcVar19 + 1,0xff,uVar11 + 1);
            pcVar8 = pcVar7 + uVar11 * -0xff + -0x10e;
            pcVar5 = pcVar19 + uVar11 + 2;
          }
          pcVar19 = pcVar5;
          *pcVar19 = (char)pcVar8;
        }
        memcpy(pcVar19 + 1,plVar15,(size_t)pcVar7);
        iVar14 = ((int)(pcVar19 + 1) + (int)pcVar7) - local_4088;
      }
    }
  }
  else {
    iVar14 = 0;
    if ((uint)inputSize < 0x7e000001) {
      plVar10 = (long *)(source + ((ulong)(uint)inputSize - 0xc));
      plVar15 = (long *)(source + 2);
      pcVar19 = dest;
      plVar9 = (long *)source;
      do {
        lVar13 = *(long *)((long)plVar9 + 1);
        plVar20 = (long *)((long)plVar9 + 1);
        uVar17 = acceleration & 0x3ffffff;
        uVar16 = acceleration * 0x40;
        while( true ) {
          plVar21 = plVar15;
          uVar16 = uVar16 + 1;
          uVar11 = (ulong)((uint)((ulong)(lVar13 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
          uVar2 = *(uint *)((long)ctx.table + uVar11 * 4);
          lVar13 = *plVar21;
          *(int *)((long)ctx.table + uVar11 * 4) = (int)plVar20 - iVar22;
          if ((plVar20 <= source + (ulong)uVar2 + 0xffff) &&
             (piVar18 = (int *)(source + uVar2), *piVar18 == (int)*plVar20)) break;
          uVar11 = (ulong)uVar17;
          uVar17 = uVar16 >> 6;
          plVar15 = (long *)(uVar11 + (long)plVar21);
          plVar20 = plVar21;
          if (plVar10 < (long *)(uVar11 + (long)plVar21)) goto LAB_001353ff;
        }
        if ((plVar9 < plVar20) && (uVar2 != 0)) {
          piVar6 = (int *)(source + ((ulong)uVar2 - 1));
          plVar15 = plVar20;
          while (piVar18 = piVar6, plVar20 = (long *)((long)plVar15 + -1),
                *(char *)plVar20 == (char)*piVar18) {
            if ((plVar20 <= plVar9) ||
               (piVar6 = (int *)((long)piVar18 + -1), plVar15 = plVar20, piVar18 <= source))
            goto LAB_001351af;
          }
          piVar18 = (int *)((long)piVar18 + 1);
          plVar20 = plVar15;
        }
LAB_001351af:
        uVar11 = (long)plVar20 - (long)plVar9;
        if (pcVar7 < pcVar19 + (uVar11 & 0xffffffff) / 0xff + (uVar11 & 0xffffffff) + 9) {
          return 0;
        }
        plVar15 = (long *)(pcVar19 + 1);
        if ((uint)uVar11 < 0xf) {
          *pcVar19 = (char)uVar11 << 4;
        }
        else {
          uVar16 = (uint)uVar11 - 0xf;
          *pcVar19 = -0x10;
          if (0xfe < (int)uVar16) {
            if (0x1fc < uVar16) {
              uVar16 = 0x1fd;
            }
            uVar16 = ((int)plVar20 - (uVar16 + (int)plVar9)) + 0xef;
            memset(plVar15,0xff,(ulong)uVar16 / 0xff + 1);
            plVar15 = (long *)(pcVar19 + (ulong)uVar16 / 0xff + 2);
            uVar16 = (((int)plVar20 - (int)plVar9) + (uVar16 % 0xff - uVar16)) - 0x10e;
          }
          *(char *)plVar15 = (char)uVar16;
          plVar15 = (long *)((long)plVar15 + 1);
        }
        plVar21 = (long *)((uVar11 & 0xffffffff) + (long)plVar15);
        do {
          *plVar15 = *plVar9;
          plVar15 = plVar15 + 1;
          plVar9 = plVar9 + 1;
        } while (plVar15 < plVar21);
        *(short *)plVar21 = (short)plVar20 - (short)piVar18;
        uVar16 = LZ4_count((BYTE *)((long)plVar20 + 4),(BYTE *)(piVar18 + 1),
                           (BYTE *)(source + ((ulong)(uint)inputSize - 5)));
        if (pcVar7 < (char *)((long)plVar21 + (ulong)(uVar16 >> 8) + 8)) {
          return 0;
        }
        plVar9 = (long *)((long)plVar20 + (ulong)(uVar16 + 4));
        pcVar8 = pcVar19;
        while( true ) {
          pcVar19 = (char *)((long)plVar21 + 2);
          if (uVar16 < 0xf) {
            *pcVar8 = *pcVar8 + (char)uVar16;
          }
          else {
            *pcVar8 = *pcVar8 + '\x0f';
            uVar11 = (ulong)(uVar16 - 0xf);
            if (0x1fd < uVar16 - 0xf) {
              uVar11 = (ulong)(uVar16 - 0x20d) % 0x1fe;
              uVar12 = (ulong)(((uVar16 - 0x20d) / 0x1fe) * 2);
              memset(pcVar19,0xff,uVar12 + 2);
              pcVar19 = (char *)((long)plVar21 + uVar12 + 4);
            }
            if (0xfe < (uint)uVar11) {
              uVar11 = (ulong)((uint)uVar11 - 0xff);
              *pcVar19 = -1;
              pcVar19 = pcVar19 + 1;
            }
            *pcVar19 = (char)uVar11;
            pcVar19 = pcVar19 + 1;
          }
          if (plVar10 < plVar9) goto LAB_001353ff;
          *(int *)((long)ctx.table +
                  (ulong)((uint)((ulong)(*(long *)((long)plVar9 + -2) * 0xcf1bbcdcbb) >> 0x1c) &
                         0xfff) * 4) = ((int)plVar9 + -2) - iVar22;
          uVar11 = (ulong)((uint)((ulong)(*plVar9 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
          uVar12 = (ulong)*(uint *)((long)ctx.table + uVar11 * 4);
          *(int *)((long)ctx.table + uVar11 * 4) = (int)plVar9 - iVar22;
          if ((source + uVar12 + 0xffff < plVar9) ||
             (piVar18 = (int *)(source + uVar12), *piVar18 != (int)*plVar9)) break;
          plVar21 = (long *)(pcVar19 + 1);
          *pcVar19 = '\0';
          *(short *)(pcVar19 + 1) = (short)plVar9 - (short)piVar18;
          uVar16 = LZ4_count((BYTE *)((long)plVar9 + 4),(BYTE *)(piVar18 + 1),
                             (BYTE *)(source + ((ulong)(uint)inputSize - 5)));
          plVar9 = (long *)((long)plVar9 + (ulong)(uVar16 + 4));
          pcVar8 = pcVar19;
          if (pcVar7 < pcVar19 + (ulong)(uVar16 >> 8) + 9) {
            return 0;
          }
        }
        plVar15 = (long *)((long)plVar9 + 2);
      } while (plVar15 <= plVar10);
LAB_001353ff:
      pcVar7 = source + ((ulong)(uint)inputSize - (long)plVar9);
      iVar14 = 0;
      if (pcVar19 + (long)(pcVar7 + ((ulong)(pcVar7 + 0xf0) / 0xff - (long)dest) + 1) <=
          (char *)(ulong)(uint)maxOutputSize) {
        if (pcVar7 < (char *)0xf) {
          *pcVar19 = (char)pcVar7 << 4;
        }
        else {
          pcVar8 = pcVar7 + -0xf;
          *pcVar19 = -0x10;
          pcVar5 = pcVar19 + 1;
          if ((char *)0xfe < pcVar8) {
            uVar11 = (ulong)(pcVar7 + -0x10e) / 0xff;
            memset(pcVar19 + 1,0xff,uVar11 + 1);
            pcVar8 = pcVar7 + uVar11 * -0xff + -0x10e;
            pcVar5 = pcVar19 + uVar11 + 2;
          }
          pcVar19 = pcVar5;
          *pcVar19 = (char)pcVar8;
        }
        memcpy(pcVar19 + 1,plVar9,(size_t)pcVar7);
        iVar14 = ((int)(pcVar19 + 1) + (int)pcVar7) - local_4088;
      }
    }
  }
  return iVar14;
}

Assistant:

int LZ4_compress_fast_force(const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t ctx;

    LZ4_resetStream(&ctx);

    if (inputSize < LZ4_64Klimit)
        return LZ4_compress_generic(&ctx, source, dest, inputSize, maxOutputSize, limitedOutput, byU16,                        noDict, noDictIssue, acceleration);
    else
        return LZ4_compress_generic(&ctx, source, dest, inputSize, maxOutputSize, limitedOutput, LZ4_64bits() ? byU32 : byPtr, noDict, noDictIssue, acceleration);
}